

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivy.h
# Opt level: O0

Ivy_Init_t Ivy_InitNotCond(Ivy_Init_t Init,int fCompl)

{
  int fCompl_local;
  Ivy_Init_t Init_local;
  
  if (Init == IVY_INIT_NONE) {
    __assert_fail("Init != IVY_INIT_NONE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivy.h"
                  ,0x149,"Ivy_Init_t Ivy_InitNotCond(Ivy_Init_t, int)");
  }
  fCompl_local = Init;
  if (fCompl != 0) {
    if (Init == IVY_INIT_0) {
      fCompl_local = 2;
    }
    else if (Init == IVY_INIT_1) {
      fCompl_local = 1;
    }
    else {
      fCompl_local = 3;
    }
  }
  return fCompl_local;
}

Assistant:

static Ivy_Init_t Ivy_InitNotCond( Ivy_Init_t Init, int fCompl )
{
    assert( Init != IVY_INIT_NONE );
    if ( fCompl == 0 )
        return Init;
    if ( Init == IVY_INIT_0 )
        return IVY_INIT_1;
    if ( Init == IVY_INIT_1 )
        return IVY_INIT_0;
    return IVY_INIT_DC;
}